

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlatest.cpp
# Opt level: O0

bool TestDigitalInputs(int curLine,AmpIO *Board,BasePort *Port,ofstream *logFile,uint qlaNum)

{
  uint8_t mask;
  sbyte sVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  uint32_t uVar5;
  ostream *poVar6;
  void *pvVar7;
  int data_shift;
  uint32_t data_mask;
  uint8_t dout4_mask;
  char buf [80];
  unsigned_long data;
  bool pass;
  uint qlaNum_local;
  ofstream *logFile_local;
  BasePort *Port_local;
  AmpIO *Board_local;
  int curLine_local;
  
  poVar6 = (ostream *)std::ostream::operator<<(logFile,std::endl<char,std::char_traits<char>>);
  poVar6 = std::operator<<(poVar6,"=== DIGITAL INPUTS ===");
  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  Amp1394Console::Print
            (curLine,9,
             "This tests the loopback on the test board between DOUT4 and all digital inputs");
  mask = '\b';
  if (qlaNum == 2) {
    mask = 0x80;
  }
  uVar3 = 0xfff;
  if (qlaNum == 2) {
    uVar3 = 0xfff0000;
  }
  sVar1 = 0;
  if (qlaNum == 2) {
    sVar1 = 0x10;
  }
  std::operator<<((ostream *)logFile,"   All inputs low: ");
  bVar2 = AmpIO::WriteDigitalOutput(Board,mask,'\0');
  if (bVar2) {
    Amp1394_Sleep(0.001);
    uVar4 = (*Port->_vptr_BasePort[0x1d])();
    if ((uVar4 & 1) == 0) {
      strcpy((char *)&data_mask,"Failed to read from board");
      poVar6 = std::operator<<((ostream *)logFile," - Failed to read from board");
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      data._3_1_ = false;
    }
    else {
      uVar5 = AmpIO::GetDigitalInput(Board);
      buf._72_8_ = ZEXT48((uVar5 & uVar3) >> sVar1);
      pvVar7 = (void *)std::ostream::operator<<(logFile,std::hex);
      std::ostream::operator<<(pvVar7,buf._72_8_);
      bVar2 = buf._72_8_ != 0;
      if (bVar2) {
        sprintf((char *)&data_mask,"Setting all inputs low - FAIL (%03lx)",buf._72_8_);
        poVar6 = std::operator<<((ostream *)logFile," - FAIL");
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      }
      else {
        sprintf((char *)&data_mask,"Setting all inputs low - PASS (%03lx)",0);
        poVar6 = std::operator<<((ostream *)logFile," - PASS");
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      }
      data._3_1_ = !bVar2;
    }
  }
  else {
    strcpy((char *)&data_mask,"Failed to write to board");
    poVar6 = std::operator<<((ostream *)logFile," - Failed to write to board");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    data._3_1_ = false;
  }
  Amp1394Console::Print(curLine + 1,9,(char *)&data_mask);
  std::operator<<((ostream *)logFile,"   All inputs high: ");
  bVar2 = AmpIO::WriteDigitalOutput(Board,mask,mask);
  if (bVar2) {
    Amp1394_Sleep(0.001);
    uVar4 = (*Port->_vptr_BasePort[0x1d])();
    if ((uVar4 & 1) == 0) {
      strcpy((char *)&data_mask,"Failed to read from board");
      poVar6 = std::operator<<((ostream *)logFile," - Failed to read from board");
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      data._3_1_ = false;
    }
    else {
      uVar5 = AmpIO::GetDigitalInput(Board);
      buf._72_8_ = ZEXT48((uVar5 & uVar3) >> sVar1);
      pvVar7 = (void *)std::ostream::operator<<(logFile,std::hex);
      std::ostream::operator<<(pvVar7,buf._72_8_);
      if (buf._72_8_ == 0xfff) {
        sprintf((char *)&data_mask,"Setting all inputs high - PASS (%03lx)",0xfff);
        poVar6 = std::operator<<((ostream *)logFile," - PASS");
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      }
      else {
        sprintf((char *)&data_mask,"Setting all inputs high - FAIL (%03lx)",buf._72_8_);
        poVar6 = std::operator<<((ostream *)logFile," - FAIL");
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        data._3_1_ = false;
      }
    }
  }
  else {
    strcpy((char *)&data_mask,"Failed to write to board");
    poVar6 = std::operator<<((ostream *)logFile," - Failed to write to board");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    data._3_1_ = false;
  }
  Amp1394Console::Print(curLine + 2,9,(char *)&data_mask);
  return data._3_1_;
}

Assistant:

bool TestDigitalInputs(int curLine, AmpIO &Board, BasePort *Port, std::ofstream &logFile, unsigned int qlaNum)
{
    bool pass = true;
    unsigned long data;
    char buf[80];

    logFile << std::endl << "=== DIGITAL INPUTS ===" << std::endl;
    Amp1394Console::Print(curLine++, 9, "This tests the loopback on the test board"
                           " between DOUT4 and all digital inputs");

    uint8_t dout4_mask = (qlaNum == 2) ? 0x80 : 0x08;
    uint32_t data_mask = (qlaNum == 2) ? 0x0fff0000 : 0x00000fff;
    int data_shift = (qlaNum == 2) ? 16 : 0;

    logFile << "   All inputs low: ";
    if (Board.WriteDigitalOutput(dout4_mask, 0x00)) {

        Amp1394_Sleep(0.001);
        if (Port->ReadAllBoards()) {
            data = (Board.GetDigitalInput() & data_mask) >> data_shift;
            logFile << std::hex << data;
            if (!data) {
                sprintf(buf, "Setting all inputs low - PASS (%03lx)", data);
                logFile << " - PASS" << std::endl;
            }
            else {
                sprintf(buf, "Setting all inputs low - FAIL (%03lx)", data);
                logFile << " - FAIL" << std::endl;
                pass = false;
            }
        }
        else {
            strcpy(buf, "Failed to read from board");
            logFile << " - Failed to read from board" << std::endl;
            pass = false;
        }
    }
    else {
        strcpy(buf, "Failed to write to board");
        logFile << " - Failed to write to board" << std::endl;
        pass = false;
    }

    Amp1394Console::Print(curLine++, 9, buf);
    logFile << "   All inputs high: ";
    if (Board.WriteDigitalOutput(dout4_mask, dout4_mask)) {

        Amp1394_Sleep(0.001);
        if (Port->ReadAllBoards()) {
            data = (Board.GetDigitalInput() & data_mask) >> data_shift;
            logFile << std::hex << data;
            if (data == 0x0fff) {
                sprintf(buf, "Setting all inputs high - PASS (%03lx)", data);
                logFile << " - PASS" << std::endl;
            }
            else {
                sprintf(buf, "Setting all inputs high - FAIL (%03lx)", data);
                logFile << " - FAIL" << std::endl;
                pass = false;
            }
        }
        else {
            strcpy(buf, "Failed to read from board");
            logFile << " - Failed to read from board" << std::endl;
            pass = false;
        }
    }
    else {
        strcpy(buf, "Failed to write to board");
        logFile << " - Failed to write to board" << std::endl;
        pass = false;
    }

    Amp1394Console::Print(curLine++, 9, buf);
    return pass;
}